

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_offset.cpp
# Opt level: O1

size_t cppurses::detail::Border_offset::north(Widget *w)

{
  size_t sVar1;
  
  if ((((w->border).enabled_ != true) || (w->outer_height_ < 2)) ||
     ((sVar1 = 1, (w->border).segments.north.enabled_ == false &&
      (((w->border).segments.north_east.enabled_ == false &&
       ((w->border).segments.north_west.enabled_ == false)))))) {
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

std::size_t Border_offset::north(const Widget& w) {
    const auto& b = w.border.segments;
    if (w.border.enabled() && !north_disqualified(w) &&
        (b.north.enabled() || b.north_east.enabled() ||
         b.north_west.enabled())) {
        return 1;
    }
    return 0;
}